

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

int8_t duckdb::SignOperator::Operation<double,signed_char>(double input)

{
  bool bVar1;
  byte bVar2;
  
  if ((input == 0.0) && (!NAN(input))) {
    return '\0';
  }
  bVar1 = Value::IsNan<double>(input);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    bVar2 = -(input <= 0.0) | 1;
  }
  return bVar2;
}

Assistant:

int8_t SignOperator::Operation(double input) {
	if (input == 0 || Value::IsNan(input)) {
		return 0;
	} else if (input > 0) {
		return 1;
	} else {
		return -1;
	}
}